

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.c
# Opt level: O2

int mbedtls_timing_self_test(int verbose)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  unsigned_long uVar5;
  undefined4 extraout_var;
  uint extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar6;
  long lVar7;
  unsigned_long msec;
  char *__s;
  ulong uVar8;
  unsigned_long msec_00;
  ulong uVar9;
  ulong uVar10;
  mbedtls_timing_delay_context ctx;
  mbedtls_timing_hr_time hires;
  
  if (verbose != 0) {
    puts("  TIMING tests note: will take some time!");
    printf("  TIMING test #1 (set_alarm / get_timer): ");
  }
  lVar7 = 1;
LAB_0013bf39:
  if (lVar7 != 4) goto code_r0x0013bf3f;
  if (verbose != 0) {
    puts("passed");
    printf("  TIMING test #2 (set/get_delay        ): ");
  }
  uVar5 = 0x96;
  iVar4 = 400;
  for (uVar10 = 200; msec = 0x32, uVar10 < 0x191; uVar10 = uVar10 + 200) {
    uVar8 = 200;
    msec_00 = uVar5;
    while (uVar8 < 0x191) {
      mbedtls_timing_set_delay(&ctx,(uint32_t)uVar10,(iVar4 + (int)uVar8) - 200);
      busy_msleep(uVar10 - (uVar10 >> 3));
      iVar3 = mbedtls_timing_get_delay(&ctx);
      if (iVar3 != 0) goto LAB_0013c0e8;
      busy_msleep(uVar10 >> 2);
      iVar3 = mbedtls_timing_get_delay(&ctx);
      if (iVar3 != 1) goto LAB_0013c0e8;
      busy_msleep(msec_00);
      iVar3 = mbedtls_timing_get_delay(&ctx);
      if (iVar3 != 1) goto LAB_0013c0e8;
      busy_msleep(msec);
      iVar3 = mbedtls_timing_get_delay(&ctx);
      uVar8 = uVar8 + 200;
      msec_00 = msec_00 + 0xaf;
      msec = msec + 0x32;
      if (iVar3 != 2) goto LAB_0013c0e8;
    }
    uVar5 = uVar5 - 0x19;
    iVar4 = iVar4 + 200;
  }
  ctx.int_ms = 0;
  ctx.fin_ms = 0;
  busy_msleep(200);
  iVar4 = mbedtls_timing_get_delay(&ctx);
  uVar10 = CONCAT44(extraout_var,iVar4);
  if (iVar4 == -1) {
    if (verbose != 0) {
      puts("passed");
      printf("  TIMING test #3 (hardclock / get_timer): ");
      uVar10 = (ulong)extraout_var_00 << 0x20;
    }
    iVar4 = 0;
    do {
      if (iVar4 == 2) {
        if (verbose != 0) {
          __s = "failed (ignored)";
LAB_0013c1d2:
          puts(__s);
          putchar(10);
        }
        return 0;
      }
      uVar8 = rdtsc();
      busy_msleep(1);
      uVar9 = rdtsc();
      uVar8 = (uVar9 & 0xffffffff00000000 | CONCAT44(extraout_var_01,(int)uVar9)) -
              (uVar8 & 0xffffffff00000000 | CONCAT44((int)(uVar10 >> 0x20),(int)uVar8));
      uVar10 = uVar8 / 5;
      uVar9 = uVar8 - uVar10;
      uVar8 = uVar8 + uVar10;
      uVar5 = 2;
      do {
        if (uVar5 == 5) {
          if (verbose == 0) {
            return 0;
          }
          __s = "passed";
          goto LAB_0013c1d2;
        }
        uVar1 = rdtsc();
        busy_msleep(uVar5);
        uVar2 = rdtsc();
        uVar10 = ((CONCAT44(extraout_var_02,(int)uVar2) | uVar2 & 0xffffffff00000000) -
                 (uVar1 & 0xffffffff00000000 | CONCAT44((int)(uVar10 >> 0x20),(int)uVar1))) / uVar5;
      } while ((uVar9 <= uVar10) && (uVar5 = uVar5 + 1, uVar10 <= uVar8));
      iVar4 = iVar4 + 1;
    } while( true );
  }
LAB_0013c0e8:
  if (verbose == 0) {
    return 1;
  }
  goto LAB_0013c0ef;
code_r0x0013bf3f:
  mbedtls_timing_get_timer(&hires,1);
  mbedtls_set_alarm((int)lVar7);
  do {
  } while (mbedtls_timing_alarmed == 0);
  uVar5 = mbedtls_timing_get_timer(&hires,0);
  if ((uVar5 < (ulong)(lVar7 * 800)) ||
     (lVar6 = lVar7 * 0x4b0, lVar7 = lVar7 + 1, lVar6 + 300U < uVar5)) {
    if (verbose != 0) {
LAB_0013c0ef:
      puts("failed");
    }
    return 1;
  }
  goto LAB_0013bf39;
}

Assistant:

int mbedtls_timing_self_test( int verbose )
{
    unsigned long cycles, ratio;
    unsigned long millisecs, secs;
    int hardfail;
    struct mbedtls_timing_hr_time hires;
    uint32_t a, b;
    mbedtls_timing_delay_context ctx;

    if( verbose != 0 )
        mbedtls_printf( "  TIMING tests note: will take some time!\n" );


    if( verbose != 0 )
        mbedtls_printf( "  TIMING test #1 (set_alarm / get_timer): " );

    for( secs = 1; secs <= 3; secs++ )
    {
        (void) mbedtls_timing_get_timer( &hires, 1 );

        mbedtls_set_alarm( (int) secs );
        while( !mbedtls_timing_alarmed )
            ;

        millisecs = mbedtls_timing_get_timer( &hires, 0 );

        /* For some reason on Windows it looks like alarm has an extra delay
         * (maybe related to creating a new thread). Allow some room here. */
        if( millisecs < 800 * secs || millisecs > 1200 * secs + 300 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            return( 1 );
        }
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

    if( verbose != 0 )
        mbedtls_printf( "  TIMING test #2 (set/get_delay        ): " );

    for( a = 200; a <= 400; a += 200 )
    {
        for( b = 200; b <= 400; b += 200 )
        {
            mbedtls_timing_set_delay( &ctx, a, a + b );

            busy_msleep( a - a / 8 );
            if( mbedtls_timing_get_delay( &ctx ) != 0 )
                FAIL;

            busy_msleep( a / 4 );
            if( mbedtls_timing_get_delay( &ctx ) != 1 )
                FAIL;

            busy_msleep( b - a / 8 - b / 8 );
            if( mbedtls_timing_get_delay( &ctx ) != 1 )
                FAIL;

            busy_msleep( b / 4 );
            if( mbedtls_timing_get_delay( &ctx ) != 2 )
                FAIL;
        }
    }

    mbedtls_timing_set_delay( &ctx, 0, 0 );
    busy_msleep( 200 );
    if( mbedtls_timing_get_delay( &ctx ) != -1 )
        FAIL;

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

    if( verbose != 0 )
        mbedtls_printf( "  TIMING test #3 (hardclock / get_timer): " );

    /*
     * Allow one failure for possible counter wrapping.
     * On a 4Ghz 32-bit machine the cycle counter wraps about once per second;
     * since the whole test is about 10ms, it shouldn't happen twice in a row.
     */
    hardfail = 0;

hard_test:
    if( hardfail > 1 )
    {
        if( verbose != 0 )
            mbedtls_printf( "failed (ignored)\n" );

        goto hard_test_done;
    }

    /* Get a reference ratio cycles/ms */
    millisecs = 1;
    cycles = mbedtls_timing_hardclock();
    busy_msleep( millisecs );
    cycles = mbedtls_timing_hardclock() - cycles;
    ratio = cycles / millisecs;

    /* Check that the ratio is mostly constant */
    for( millisecs = 2; millisecs <= 4; millisecs++ )
    {
        cycles = mbedtls_timing_hardclock();
        busy_msleep( millisecs );
        cycles = mbedtls_timing_hardclock() - cycles;

        /* Allow variation up to 20% */
        if( cycles / millisecs < ratio - ratio / 5 ||
            cycles / millisecs > ratio + ratio / 5 )
        {
            hardfail++;
            goto hard_test;
        }
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

hard_test_done:

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    return( 0 );
}